

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O0

void h264_print_dec_ref_pic_marking(int idr_pic_flag,h264_dec_ref_pic_marking *ref)

{
  long lVar1;
  uint *in_RSI;
  int in_EDI;
  int i;
  int local_14;
  
  if (in_EDI == 0) {
    printf("\tadaptive_ref_pic_marking_mode_flag = %d\n",(ulong)in_RSI[2]);
    if (in_RSI[2] != 0) {
      local_14 = 0;
      do {
        printf("\tmemory_management_control_operation = %d\n",
               (ulong)*(uint *)(*(long *)(in_RSI + 4) + (long)local_14 * 0x14));
        switch(*(undefined4 *)(*(long *)(in_RSI + 4) + (long)local_14 * 0x14)) {
        case 0:
          break;
        case 1:
          printf("\tdifference_of_pic_nums_minus1 = %d\n",
                 (ulong)*(uint *)(*(long *)(in_RSI + 4) + (long)local_14 * 0x14 + 4));
          break;
        case 2:
          printf("\tlong_term_pic_num = %d\n",
                 (ulong)*(uint *)(*(long *)(in_RSI + 4) + (long)local_14 * 0x14 + 8));
          break;
        case 3:
          printf("\tdifference_of_pic_nums_minus1 = %d\n",
                 (ulong)*(uint *)(*(long *)(in_RSI + 4) + (long)local_14 * 0x14 + 4));
          printf("\tlong_term_frame_idx = %d\n",
                 (ulong)*(uint *)(*(long *)(in_RSI + 4) + (long)local_14 * 0x14 + 0xc));
          break;
        case 4:
          printf("\tmax_long_term_frame_idx_plus1 = %d\n",
                 (ulong)*(uint *)(*(long *)(in_RSI + 4) + (long)local_14 * 0x14 + 0x10));
          break;
        case 5:
          break;
        case 6:
          printf("\tlong_term_frame_idx = %d\n",
                 (ulong)*(uint *)(*(long *)(in_RSI + 4) + (long)local_14 * 0x14 + 0xc));
        }
        lVar1 = (long)local_14;
        local_14 = local_14 + 1;
      } while (*(int *)(*(long *)(in_RSI + 4) + lVar1 * 0x14) != 0);
    }
  }
  else {
    printf("\tno_output_of_prior_pics_flag = %d\n",(ulong)*in_RSI);
    printf("\tlong_term_reference_flag = %d\n",(ulong)in_RSI[1]);
  }
  return;
}

Assistant:

void h264_print_dec_ref_pic_marking(int idr_pic_flag, struct h264_dec_ref_pic_marking *ref) {
	if (idr_pic_flag) {
		printf("\tno_output_of_prior_pics_flag = %d\n", ref->no_output_of_prior_pics_flag);
		printf("\tlong_term_reference_flag = %d\n", ref->long_term_reference_flag);
	} else {
		printf("\tadaptive_ref_pic_marking_mode_flag = %d\n", ref->adaptive_ref_pic_marking_mode_flag);
		if (ref->adaptive_ref_pic_marking_mode_flag) {
			int i = 0;
			do {
				printf("\tmemory_management_control_operation = %d\n", ref->mmcos[i].memory_management_control_operation);
				switch (ref->mmcos[i].memory_management_control_operation) {
					case H264_MMCO_END:
						break;
					case H264_MMCO_FORGET_SHORT:
						printf("\tdifference_of_pic_nums_minus1 = %d\n", ref->mmcos[i].difference_of_pic_nums_minus1);
						break;
					case H264_MMCO_FORGET_LONG:
						printf("\tlong_term_pic_num = %d\n", ref->mmcos[i].long_term_pic_num);
						break;
					case H264_MMCO_SHORT_TO_LONG:
						printf("\tdifference_of_pic_nums_minus1 = %d\n", ref->mmcos[i].difference_of_pic_nums_minus1);
						printf("\tlong_term_frame_idx = %d\n", ref->mmcos[i].long_term_frame_idx);
						break;
					case H264_MMCO_FORGET_LONG_MANY:
						printf("\tmax_long_term_frame_idx_plus1 = %d\n", ref->mmcos[i].max_long_term_frame_idx_plus1);
						break;
					case H264_MMCO_FORGET_ALL:
						break;
					case H264_MMCO_THIS_TO_LONG:
						printf("\tlong_term_frame_idx = %d\n", ref->mmcos[i].long_term_frame_idx);
						break;
				}
			} while (ref->mmcos[i++].memory_management_control_operation != H264_MMCO_END);
		}
	}
}